

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

pair<cmQtAutoGen::IntegerVersion,_unsigned_int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget *target,string *mocExecutable)

{
  cmMakefile *pcVar1;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> pVar2;
  const_iterator ppVar3;
  value_type vVar4;
  bool bVar5;
  char *input;
  size_type sVar6;
  basic_string_view<char,_std::char_traits<char>_> *pbVar7;
  reference pvVar8;
  reference pIVar9;
  ulong uVar10;
  string local_208;
  value_type local_1e8;
  IntegerVersion it;
  iterator __end3;
  iterator __begin3;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *__range3;
  string local_1c0;
  string *local_1a0;
  allocator<char> local_191;
  string local_190;
  cmValue local_170;
  const_iterator local_168;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *keyPair_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1_1;
  string local_140;
  string *local_120;
  allocator<char> local_111;
  string local_110;
  cmValue local_f0;
  const_iterator local_e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *keyPair;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1;
  anon_class_16_2_f7459e05 addVersion;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> knownQtVersions;
  string local_98;
  allocator<char> local_61;
  string local_60;
  uint local_3c;
  IntegerVersion local_38;
  undefined1 local_2a [2];
  anon_class_1_0_00000001 toUInt2;
  string *psStack_28;
  anon_class_1_0_00000001 toUInt;
  string *mocExecutable_local;
  cmGeneratorTarget *target_local;
  uint uStack_10;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> res;
  
  local_38.Major = 0;
  local_38.Minor = 0;
  psStack_28 = mocExecutable;
  cmQtAutoGen::IntegerVersion::IntegerVersion(&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"QT_MAJOR_VERSION",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"",
             (allocator<char> *)
             ((long)&knownQtVersions.
                     super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  input = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(target,&local_60,&local_98);
  local_3c = GetQtVersion::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)(local_2a + 1),input);
  std::pair<cmQtAutoGen::IntegerVersion,_unsigned_int>::
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int,_true>
            ((pair<cmQtAutoGen::IntegerVersion,_unsigned_int> *)((long)&target_local + 4),&local_38,
             &local_3c);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&knownQtVersions.
                     super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::vector
            ((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *)
             &addVersion.toUInt2);
  sVar6 = std::
          initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::size(&GetQtVersion::keys);
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::reserve
            ((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *)
             &addVersion.toUInt2,sVar6 * 2);
  __range1 = (initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&addVersion.toUInt2;
  addVersion.knownQtVersions =
       (vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *)local_2a
  ;
  __begin1 = (const_iterator)&GetQtVersion::keys;
  __end1 = std::
           initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin(&GetQtVersion::keys);
  keyPair = std::
            initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::end(&GetQtVersion::keys);
  for (; ppVar3 = __end1, __end1 != keyPair; __end1 = __end1 + 1) {
    local_e8 = __end1;
    pcVar1 = target->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_110,&ppVar3->first,&local_111);
    local_f0 = cmMakefile::GetDefinition(pcVar1,&local_110);
    pcVar1 = target->Makefile;
    pbVar7 = &local_e8->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_140,pbVar7,(allocator<char> *)((long)&__range1_1 + 7));
    local_120 = (string *)cmMakefile::GetDefinition(pcVar1,&local_140);
    GetQtVersion::anon_class_16_2_f7459e05::operator()
              ((anon_class_16_2_f7459e05 *)&__range1,local_f0,(cmValue)local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  __begin1_1 = (const_iterator)&GetQtVersion::keys;
  __end1_1 = std::
             initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin(&GetQtVersion::keys);
  keyPair_1 = std::
              initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::end(&GetQtVersion::keys);
  for (; ppVar3 = __end1_1, __end1_1 != keyPair_1; __end1_1 = __end1_1 + 1) {
    local_168 = __end1_1;
    pcVar1 = target->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_190,&ppVar3->first,&local_191);
    local_170 = cmMakefile::GetProperty(pcVar1,&local_190);
    pcVar1 = target->Makefile;
    pbVar7 = &local_168->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_1c0,pbVar7,(allocator<char> *)((long)&__range3 + 7));
    local_1a0 = (string *)cmMakefile::GetProperty(pcVar1,&local_1c0);
    GetQtVersion::anon_class_16_2_f7459e05::operator()
              ((anon_class_16_2_f7459e05 *)&__range1,local_170,(cmValue)local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  bVar5 = std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::
          empty((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *
                )&addVersion.toUInt2);
  vVar4 = stack0xffffffffffffffec;
  if (!bVar5) {
    if (res.first.Major == 0) {
      pvVar8 = std::
               vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::at
                         ((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                           *)&addVersion.toUInt2,0);
      vVar4 = *pvVar8;
    }
    else {
      __end3 = std::
               vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::
               begin((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                      *)&addVersion.toUInt2);
      it = (IntegerVersion)
           std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::
           end((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *)
               &addVersion.toUInt2);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmQtAutoGen::IntegerVersion_*,_std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>_>
                                         *)&it), vVar4 = stack0xffffffffffffffec, bVar5) {
        pIVar9 = __gnu_cxx::
                 __normal_iterator<cmQtAutoGen::IntegerVersion_*,_std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>_>
                 ::operator*(&__end3);
        local_1e8.Major = pIVar9->Major;
        local_1e8.Minor = pIVar9->Minor;
        vVar4 = local_1e8;
        if (local_1e8.Major == res.first.Major) break;
        __gnu_cxx::
        __normal_iterator<cmQtAutoGen::IntegerVersion_*,_std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>_>
        ::operator++(&__end3);
      }
    }
  }
  stack0xffffffffffffffec = vVar4;
  if (target_local._4_4_ == 0) {
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) != 0) {
      FindMocExecutableFromMocTarget_abi_cxx11_(&local_208,target->Makefile,res.first.Major);
      std::__cxx11::string::operator=((string *)mocExecutable,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
    }
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      register0x00000000 = GetMocVersion(mocExecutable);
    }
  }
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::~vector
            ((vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *)
             &addVersion.toUInt2);
  pVar2.second = res.first.Major;
  pVar2.first.Major = target_local._4_4_;
  pVar2.first.Minor = uStack_10;
  return pVar2;
}

Assistant:

std::pair<cmQtAutoGen::IntegerVersion, unsigned int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget const* target,
                                     std::string mocExecutable)
{
  // Converts a char ptr to an unsigned int value
  auto toUInt = [](const char* const input) -> unsigned int {
    unsigned long tmp = 0;
    if (input && cmStrToULong(input, &tmp)) {
      return static_cast<unsigned int>(tmp);
    }
    return 0u;
  };
  auto toUInt2 = [](cmValue input) -> unsigned int {
    unsigned long tmp = 0;
    if (input && cmStrToULong(*input, &tmp)) {
      return static_cast<unsigned int>(tmp);
    }
    return 0u;
  };

  // Initialize return value to a default
  std::pair<IntegerVersion, unsigned int> res(
    IntegerVersion(),
    toUInt(target->GetLinkInterfaceDependentStringProperty("QT_MAJOR_VERSION",
                                                           "")));

  // Acquire known Qt versions
  std::vector<cmQtAutoGen::IntegerVersion> knownQtVersions;
  {
    // Qt version variable prefixes
    static std::initializer_list<
      std::pair<cm::string_view, cm::string_view>> const keys{
      { "Qt6Core_VERSION_MAJOR", "Qt6Core_VERSION_MINOR" },
      { "Qt5Core_VERSION_MAJOR", "Qt5Core_VERSION_MINOR" },
      { "QT_VERSION_MAJOR", "QT_VERSION_MINOR" },
    };

    knownQtVersions.reserve(keys.size() * 2);

    // Adds a version to the result (nullptr safe)
    auto addVersion = [&knownQtVersions, &toUInt2](cmValue major,
                                                   cmValue minor) {
      cmQtAutoGen::IntegerVersion ver(toUInt2(major), toUInt2(minor));
      if (ver.Major != 0) {
        knownQtVersions.emplace_back(ver);
      }
    };

    // Read versions from variables
    for (auto const& keyPair : keys) {
      addVersion(target->Makefile->GetDefinition(std::string(keyPair.first)),
                 target->Makefile->GetDefinition(std::string(keyPair.second)));
    }

    // Read versions from directory properties
    for (auto const& keyPair : keys) {
      addVersion(target->Makefile->GetProperty(std::string(keyPair.first)),
                 target->Makefile->GetProperty(std::string(keyPair.second)));
    }
  }

  // Evaluate known Qt versions
  if (!knownQtVersions.empty()) {
    if (res.second == 0) {
      // No specific version was requested by the target:
      // Use highest known Qt version.
      res.first = knownQtVersions.at(0);
    } else {
      // Pick a version from the known versions:
      for (auto it : knownQtVersions) {
        if (it.Major == res.second) {
          res.first = it;
          break;
        }
      }
    }
  }

  if (res.first.Major == 0) {
    // We could not get the version number from variables or directory
    // properties. This might happen if the find_package call for Qt is wrapped
    // in a function. Try to find the moc executable path from the available
    // targets and call "moc --version" to get the Qt version.
    if (mocExecutable.empty()) {
      mocExecutable =
        FindMocExecutableFromMocTarget(target->Makefile, res.second);
    }
    if (!mocExecutable.empty()) {
      res.first = GetMocVersion(mocExecutable);
    }
  }

  return res;
}